

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

void __thiscall TcpSocketImpl::WriteThread(TcpSocketImpl *this)

{
  atomic_uchar *paVar1;
  uint __fd;
  _Map_pointer pptVar2;
  _Elt_pointer ptVar3;
  _Head_base<1UL,_unsigned_long,_false> _Var4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ssize_t sVar8;
  long *__s;
  long *plVar9;
  int *piVar10;
  ulong uVar11;
  pointer *__ptr;
  unsigned_long __n2;
  bool bVar12;
  thread thErrorCb;
  DATA data;
  socklen_t iLen;
  unique_lock<std::mutex> lock;
  timeval timeout;
  fd_set errorfd;
  fd_set writefd;
  _Head_base<0UL,_unsigned_char_*,_false> local_198;
  _Head_base<1UL,_unsigned_long,_false> local_190;
  _Head_base<0UL,_unsigned_char_*,_false> local_188;
  unsigned_long local_180;
  pthread_mutex_t *local_178;
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
  *local_170;
  unique_lock<std::mutex> local_168;
  timeval local_158;
  int *local_140;
  fd_set local_138;
  fd_set local_b8;
  
  LOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  (paVar1->super___atomic_base<unsigned_char>)._M_i =
       (paVar1->super___atomic_base<unsigned_char>)._M_i & 0xfd;
  UNLOCK();
  local_168._M_device = &(this->super_BaseSocketImpl).m_mxWrite;
  local_168._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_168);
  local_168._M_owns = true;
  local_140 = &(this->super_BaseSocketImpl).m_iError;
  local_178 = (pthread_mutex_t *)&this->m_mxOutDeque;
  local_170 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
               *)&this->m_quOutData;
  do {
    while( true ) {
      if ((this->m_bCloseReq != false) &&
         ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0)) goto LAB_0011820d;
      if ((this->m_bCloseReq == false) &&
         ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0)) {
        while (((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0 &&
               (this->m_bCloseReq == false))) {
          std::condition_variable::wait((unique_lock *)&this->m_cv);
        }
      }
      if ((this->super_BaseSocketImpl).m_fSock == -1) goto LAB_0011820d;
      if ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i != 0) break;
LAB_00118203:
      if ((this->super_BaseSocketImpl).m_iError != 0) goto LAB_0011820d;
    }
    local_158.tv_sec = 1;
    local_158.tv_usec = 0;
    local_b8.fds_bits[0xe] = 0;
    local_b8.fds_bits[0xf] = 0;
    local_b8.fds_bits[0xc] = 0;
    local_b8.fds_bits[0xd] = 0;
    local_b8.fds_bits[10] = 0;
    local_b8.fds_bits[0xb] = 0;
    local_b8.fds_bits[8] = 0;
    local_b8.fds_bits[9] = 0;
    local_b8.fds_bits[6] = 0;
    local_b8.fds_bits[7] = 0;
    local_b8.fds_bits[4] = 0;
    local_b8.fds_bits[5] = 0;
    local_b8.fds_bits[2] = 0;
    local_b8.fds_bits[3] = 0;
    local_b8.fds_bits[0] = 0;
    local_b8.fds_bits[1] = 0;
    local_138.fds_bits[0xe] = 0;
    local_138.fds_bits[0xf] = 0;
    local_138.fds_bits[0xc] = 0;
    local_138.fds_bits[0xd] = 0;
    local_138.fds_bits[10] = 0;
    local_138.fds_bits[0xb] = 0;
    local_138.fds_bits[8] = 0;
    local_138.fds_bits[9] = 0;
    local_138.fds_bits[6] = 0;
    local_138.fds_bits[7] = 0;
    local_138.fds_bits[4] = 0;
    local_138.fds_bits[5] = 0;
    local_138.fds_bits[2] = 0;
    local_138.fds_bits[3] = 0;
    local_138.fds_bits[0] = 0;
    local_138.fds_bits[1] = 0;
    iVar6 = (this->super_BaseSocketImpl).m_fSock;
    iVar5 = iVar6 + 0x3f;
    if (-1 < iVar6) {
      iVar5 = iVar6;
    }
    uVar11 = 1L << ((byte)iVar6 & 0x3f);
    local_b8.fds_bits[iVar5 >> 6] = local_b8.fds_bits[iVar5 >> 6] | uVar11;
    local_138.fds_bits[iVar5 >> 6] = local_138.fds_bits[iVar5 >> 6] | uVar11;
    iVar6 = select(iVar6 + 1,(fd_set *)0x0,&local_b8,&local_138,&local_158);
    if (iVar6 == 0) {
      iVar6 = 3 - (uint)(this->m_bCloseReq == false);
    }
    else {
      __fd = (this->super_BaseSocketImpl).m_fSock;
      uVar7 = __fd + 0x3f;
      if (-1 < (int)__fd) {
        uVar7 = __fd;
      }
      if (((ulong)local_138.fds_bits[(int)uVar7 >> 6] >> ((ulong)__fd & 0x3f) & 1) == 0) {
        iVar6 = pthread_mutex_lock(local_178);
        if (iVar6 != 0) {
          std::__throw_system_error(iVar6);
        }
        pptVar2 = (this->m_quOutData).
                  super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
        ptVar3 = (this->m_quOutData).
                 super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (((long)(this->m_quOutData).
                   super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last - (long)ptVar3 >> 4) +
            ((long)(this->m_quOutData).
                   super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)(this->m_quOutData).
                   super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
            ((((ulong)((long)pptVar2 -
                      (long)(this->m_quOutData).
                            super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(pptVar2 == (_Map_pointer)0x0)) * 0x20 == 0) {
          LOCK();
          (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i = 0;
          UNLOCK();
          pthread_mutex_unlock(local_178);
          iVar6 = 2;
        }
        else {
          local_190._M_head_impl =
               (ptVar3->
               super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
               ).super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
               _M_head_impl;
          local_188._M_head_impl =
               (ptVar3->
               super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
               ).
               super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
               ._M_head_impl._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          (ptVar3->
          super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
          ).
          super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
          ._M_head_impl._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false> =
               (_Head_base<0UL,_unsigned_char_*,_false>)0x0;
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
          ::pop_front((deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                       *)local_170);
          LOCK();
          (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
               (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i - local_190._M_head_impl
          ;
          UNLOCK();
          pthread_mutex_unlock(local_178);
          sVar8 = send((this->super_BaseSocketImpl).m_fSock,local_188._M_head_impl,
                       (long)(int)local_190._M_head_impl,0);
          _Var4._M_head_impl = local_190._M_head_impl;
          if ((int)(uint)sVar8 < 1) {
            piVar10 = __errno_location();
            _Var4._M_head_impl = local_190._M_head_impl;
            iVar5 = *piVar10;
            if (iVar5 == 0xb) {
              plVar9 = (long *)operator_new__(local_190._M_head_impl);
              memset(plVar9,0,_Var4._M_head_impl);
              local_198._M_head_impl = (uchar *)plVar9;
              if ((long *)_Var4._M_head_impl != (long *)0x0) {
                memmove(plVar9,local_188._M_head_impl,_Var4._M_head_impl);
              }
              iVar6 = pthread_mutex_lock(local_178);
              if (iVar6 != 0) {
                std::__throw_system_error(iVar6);
              }
              LOCK();
              (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
                   (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i +
                   local_190._M_head_impl;
              UNLOCK();
              std::
              deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
              ::
              emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                        (local_170,
                         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                         &local_198,&local_190._M_head_impl);
              pthread_mutex_unlock(local_178);
              if ((long *)local_198._M_head_impl != (long *)0x0) {
                operator_delete__(local_198._M_head_impl);
              }
              iVar6 = 0;
            }
            else {
              (this->super_BaseSocketImpl).m_iError = iVar5;
              (this->super_BaseSocketImpl).m_iErrLoc = 3;
              std::unique_lock<std::mutex>::unlock(&local_168);
              local_180 = 0;
              local_198._M_head_impl = (uchar *)operator_new(0x10);
              *(undefined ***)local_198._M_head_impl = &PTR___State_001476e8;
              *(TcpSocketImpl **)((long)local_198._M_head_impl + 8) = this;
              std::thread::_M_start_thread(&local_180,&local_198,0);
              if ((long *)local_198._M_head_impl != (long *)0x0) {
                (**(code **)(*(long *)local_198._M_head_impl + 8))();
              }
              std::thread::join();
              std::unique_lock<std::mutex>::lock(&local_168);
              if (local_180 != 0) goto LAB_00118357;
              iVar6 = 3;
            }
            if (iVar5 == 0xb) goto LAB_001181db;
          }
          else {
            plVar9 = (long *)(ulong)((uint)sVar8 & 0x7fffffff);
            uVar11 = local_190._M_head_impl - (long)plVar9;
            if (plVar9 <= local_190._M_head_impl && uVar11 != 0) {
              __s = (long *)operator_new__(uVar11);
              memset(__s,0,uVar11);
              local_198._M_head_impl = (uchar *)__s;
              if ((long *)_Var4._M_head_impl != plVar9) {
                memmove(__s,local_188._M_head_impl + (long)plVar9,uVar11);
              }
              iVar6 = pthread_mutex_lock(local_178);
              if (iVar6 != 0) {
                std::__throw_system_error(iVar6);
              }
              LOCK();
              (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
                   local_190._M_head_impl +
                   ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i - (long)plVar9);
              UNLOCK();
              local_180 = local_190._M_head_impl - (long)plVar9;
              std::
              deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
              ::
              emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                        (local_170,
                         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                         &local_198,&local_180);
              pthread_mutex_unlock(local_178);
              if ((long *)local_198._M_head_impl != (long *)0x0) {
                operator_delete__(local_198._M_head_impl);
              }
            }
LAB_001181db:
            iVar6 = 0;
          }
          if (local_188._M_head_impl != (uchar *)0x0) {
            operator_delete__(local_188._M_head_impl);
          }
        }
      }
      else {
        iVar6 = 3;
        if (*local_140 == 0) {
          local_180 = CONCAT44(local_180._4_4_,4);
          getsockopt(__fd,1,4,local_140,(socklen_t *)&local_180);
          (this->super_BaseSocketImpl).m_iErrLoc = 2;
          std::unique_lock<std::mutex>::unlock(&local_168);
          local_198._M_head_impl = (uchar *)0x0;
          local_190._M_head_impl = (unsigned_long)operator_new(0x10);
          *(undefined ***)local_190._M_head_impl = &PTR___State_001476a8;
          *(TcpSocketImpl **)(local_190._M_head_impl + 8) = this;
          std::thread::_M_start_thread(&local_198,&local_190,0);
          if ((long *)local_190._M_head_impl != (long *)0x0) {
            (**(code **)(*(long *)local_190._M_head_impl + 8))();
          }
          std::thread::join();
          std::unique_lock<std::mutex>::lock(&local_168);
          if ((long *)local_198._M_head_impl != (long *)0x0) {
LAB_00118357:
            std::terminate();
          }
        }
      }
    }
    if (iVar6 == 0) goto LAB_00118203;
  } while (iVar6 == 2);
LAB_0011820d:
  std::unique_lock<std::mutex>::unlock(&local_168);
  if ((((this->super_BaseSocketImpl).m_iError == 0) &&
      (iVar6 = (this->super_BaseSocketImpl).m_fSock, iVar6 != -1)) &&
     (iVar6 = shutdown(iVar6,1), iVar6 != 0)) {
    piVar10 = __errno_location();
    (this->super_BaseSocketImpl).m_iError = *piVar10;
    (this->super_BaseSocketImpl).m_iErrLoc = 4;
  }
  LOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  (paVar1->super___atomic_base<unsigned_char>)._M_i =
       (paVar1->super___atomic_base<unsigned_char>)._M_i | 2;
  UNLOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  LOCK();
  bVar12 = (paVar1->super___atomic_base<unsigned_char>)._M_i == '\a';
  if (bVar12) {
    (paVar1->super___atomic_base<unsigned_char>)._M_i = '\x0f';
  }
  UNLOCK();
  if (bVar12) {
    iVar6 = (this->super_BaseSocketImpl).m_fSock;
    if (iVar6 != -1) {
      close(iVar6);
      (this->super_BaseSocketImpl).m_fSock = -1;
    }
    (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
    if ((this->m_pRefServSocket != (TcpServer *)0x0) || (this->m_bSelfDelete == true)) {
      (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x16])(this);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_168);
  return;
}

Assistant:

void TcpSocketImpl::WriteThread()
{
    m_iShutDownState &= static_cast<uint8_t>(~2);

    unique_lock<mutex> lock(m_mxWrite);

    while (m_bCloseReq == false || m_atOutBytes != 0)
    {
        if (m_bCloseReq == false && m_atOutBytes == 0)
            m_cv.wait(lock, [&]() noexcept { return m_atOutBytes == 0 ? m_bCloseReq : true; });

        if (m_fSock == INVALID_SOCKET)
            break;

        if (m_atOutBytes != 0)
        {
            fd_set writefd{}, errorfd{};
            struct timeval timeout{};

            timeout.tv_sec = 1;
            timeout.tv_usec = 0;
            FD_ZERO(&writefd);
            FD_ZERO(&errorfd);

            FD_SET(m_fSock, &writefd);
            FD_SET(m_fSock, &errorfd);

            if (::select(static_cast<int>(m_fSock + 1), nullptr, &writefd, &errorfd, &timeout) == 0)
            {
                if (m_bCloseReq == false) continue;
                break;
            }

            if (FD_ISSET(m_fSock, &errorfd))
            {
                if (m_iError == 0)
                {
                    socklen_t iLen = sizeof(m_iError);
                    getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                    m_iErrLoc = 2;
                    lock.unlock();
                    thread thErrorCb([&]()
                    {
                        if (m_fErrorParam && m_bStop == false)
                            m_fErrorParam(m_pBkRef, m_pvUserData);
                        else if (m_fError && m_bStop == false)
                            m_fError(m_pBkRef);
                    });
                    thErrorCb.join();
                    lock.lock();
                }
                break;
            }

            m_mxOutDeque.lock();
            if (m_quOutData.size() == 0)
            {
                m_atOutBytes = 0;
                m_mxOutDeque.unlock();
                continue;
            }
            DATA data = move(m_quOutData.front());
            m_quOutData.pop_front();
            m_atOutBytes -= BUFLEN(data);
            m_mxOutDeque.unlock();

            const uint32_t transferred = ::send(m_fSock, reinterpret_cast<char*>(&BUFFER(data)[0]), static_cast<int>(BUFLEN(data)), 0);
            if (static_cast<int32_t>(transferred) <= 0)
            {
                const int iError = WSAGetLastError();
                if (iError != WSAEWOULDBLOCK)
                {
                    m_iError = iError;
                    m_iErrLoc = 3;
                    lock.unlock();
                    thread thErrorCb([&]()
                    {
                        if (m_fErrorParam && m_bStop == false)
                            m_fErrorParam(m_pBkRef, m_pvUserData);
                        else if (m_fError && m_bStop == false)
                            m_fError(m_pBkRef);
                    });
                    thErrorCb.join();
                    lock.lock();
                    break;
                }
                // Put the not send bytes back into the que if it is not a SSL connection. A SSL connection has the bytes still available
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data));
                copy_n(&BUFFER(data)[0], BUFLEN(data), &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += BUFLEN(data);
                m_quOutData.emplace_front(move(tmp), BUFLEN(data));
                m_mxOutDeque.unlock();
            }
            else if (transferred < BUFLEN(data)) // Less bytes send as buffer size, we put the rast back in your que
            {
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data) - transferred);
                copy_n(&BUFFER(data)[transferred], BUFLEN(data) - transferred, &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += (BUFLEN(data) - transferred);
                m_quOutData.emplace_front(move(tmp), (BUFLEN(data) - transferred));
                m_mxOutDeque.unlock();
            }
        }

        if (m_iError != 0)
            break;
    }

    lock.unlock();

    // if we get out of the while loop, the stop request was send or we have an error
    if (m_iError == 0 && m_fSock != INVALID_SOCKET)
    {
        if (::shutdown(m_fSock, SD_SEND) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
            m_iErrLoc = 4;
        }
    }
    m_iShutDownState |= 2;

    unsigned char cExpected = 7;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
        {
            ::closesocket(m_fSock);
            m_fSock = INVALID_SOCKET;
        }
        StartClosingCB();

        if (m_pRefServSocket != nullptr || m_bSelfDelete == true)    // Auto-delete, socket created from server socket
            Delete();// thread([&]() { delete this; }).detach();
    }
}